

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void sysbvm_function_recordBindingWithOwnerAndName
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t owner,
               sysbvm_tuple_t name)

{
  _Bool _Var1;
  sysbvm_function_t *functionObject;
  sysbvm_tuple_t name_local;
  sysbvm_tuple_t owner_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isFunction(context,function);
  if ((_Var1) &&
     (sysbvm_programEntity_recordBindingWithOwnerAndName(context,function,owner,name),
     *(long *)(function + 0x48) != 0)) {
    sysbvm_programEntity_recordBindingWithOwnerAndName
              (context,*(sysbvm_tuple_t *)(function + 0x48),owner,name);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_function_recordBindingWithOwnerAndName(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t owner, sysbvm_tuple_t name)
{
    (void)context;
    if(!sysbvm_tuple_isFunction(context, function)) return;

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    sysbvm_programEntity_recordBindingWithOwnerAndName(context, function, owner, name);

    // Record the owner also in the definition.
    if(functionObject->definition)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, functionObject->definition, owner, name);
}